

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall
QColorDialogPrivate::setCurrentColor
          (QColorDialogPrivate *this,QColor *color,SetColorMode setColorMode)

{
  QRgb rgb;
  int a;
  QPlatformDialogHelper *pQVar1;
  
  if ((this->super_QDialogPrivate).nativeDialogInUse == true) {
    pQVar1 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,color);
    return;
  }
  if ((setColorMode & ShowColor) != 0) {
    rgb = QColor::rgb();
    setCurrentRgbColor(this,rgb);
    a = QColor::alpha();
    setCurrentAlpha(this,a);
  }
  if ((setColorMode & SelectColor) == 0) {
    return;
  }
  selectColor(this,color);
  return;
}

Assistant:

void QColorDialogPrivate::setCurrentColor(const QColor &color,  SetColorMode setColorMode)
{
    if (nativeDialogInUse) {
        platformColorDialogHelper()->setCurrentColor(color);
        return;
    }

    if (setColorMode & ShowColor) {
        setCurrentRgbColor(color.rgb());
        setCurrentAlpha(color.alpha());
    }
    if (setColorMode & SelectColor)
        selectColor(color);
}